

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * ParseXMLElement(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory *pTVar2;
  Bool BVar3;
  int iVar4;
  NodeType NVar5;
  uint uVar6;
  Node *pNVar7;
  uint code;
  Node **ppNVar8;
  GetTokenMode mode_00;
  Node *pNVar9;
  
  pLVar1 = doc->lexer;
  if (element == (Node *)0x0) {
    uVar6 = (doc->stack).top;
    pTVar2 = (doc->stack).content;
    element = pTVar2[uVar6].original_node;
    pNVar7 = pTVar2[uVar6].reentry_node;
    mode_00 = pTVar2[uVar6].reentry_mode;
    (doc->stack).top = uVar6 - 1;
    pNVar7->parent = element;
    if (element == (Node *)0x0) {
      pNVar7->prev = (Node *)0x0;
      element = (Node *)0x0;
    }
    else {
      pNVar9 = element->last;
      pNVar7->prev = pNVar9;
      ppNVar8 = &pNVar9->next;
      if (pNVar9 == (Node *)0x0) {
        ppNVar8 = &element->content;
      }
      *ppNVar8 = pNVar7;
      element->last = pNVar7;
    }
  }
  else {
    BVar3 = prvTidyXMLPreserveWhiteSpace(doc,element);
    mode_00 = Preformatted;
    if (BVar3 == no) {
      mode_00 = mode;
    }
    InsertMisc(&doc->root,element);
    BVar3 = prvTidynodeIsText(element);
    if (BVar3 != no) {
      prvTidyReport(doc,&doc->root,element,0x235);
      prvTidyFreeNode(doc,element);
      return (Node *)0x0;
    }
  }
  pNVar7 = prvTidyGetToken(doc,mode_00);
  if (pNVar7 != (Node *)0x0) {
    do {
      NVar5 = pNVar7->type;
      if (NVar5 == EndTag) {
        if (pNVar7->element == (ctmbstr)0x0) goto LAB_0013ef5e;
        if (element->element != (ctmbstr)0x0) {
          iVar4 = prvTidytmbstrcmp(pNVar7->element,element->element);
          if (iVar4 != 0) {
            NVar5 = pNVar7->type;
            goto LAB_0013ef30;
          }
          prvTidyFreeNode(doc,pNVar7);
          element->closed = yes;
          break;
        }
LAB_0013ef63:
        code = 0x286;
        pNVar9 = element;
LAB_0013ef80:
        prvTidyReport(doc,pNVar9,pNVar7,code);
        prvTidyFreeNode(doc,pNVar7);
      }
      else {
LAB_0013ef30:
        if (NVar5 == EndTag) {
LAB_0013ef5e:
          if (element != (Node *)0x0) goto LAB_0013ef63;
          pNVar9 = (Node *)0x0;
          code = 0x285;
          goto LAB_0013ef80;
        }
        if (NVar5 == StartTag) {
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT2848(CONCAT424(mode_00,CONCAT816(pNVar7,CONCAT88(element,
                                                  ParseXMLElement)))));
          return pNVar7;
        }
        pNVar7->parent = element;
        if (element == (Node *)0x0) {
          pNVar7->prev = (Node *)0x0;
        }
        else {
          pNVar9 = element->last;
          pNVar7->prev = pNVar9;
          ppNVar8 = &pNVar9->next;
          if (pNVar9 == (Node *)0x0) {
            ppNVar8 = &element->content;
          }
          *ppNVar8 = pNVar7;
          element->last = pNVar7;
        }
      }
      pNVar7 = prvTidyGetToken(doc,mode_00);
    } while (pNVar7 != (Node *)0x0);
  }
  pNVar7 = element->content;
  BVar3 = prvTidynodeIsText(pNVar7);
  if ((((mode_00 != Preformatted) && (BVar3 != no)) && (pLVar1->lexbuf[pNVar7->start] == ' ')) &&
     (uVar6 = pNVar7->start + 1, pNVar7->start = uVar6, pNVar7->end <= uVar6)) {
    prvTidyDiscardElement(doc,pNVar7);
  }
  pNVar7 = element->last;
  BVar3 = prvTidynodeIsText(pNVar7);
  if (((mode_00 != Preformatted) && (BVar3 != no)) &&
     ((uVar6 = pNVar7->end - 1, pLVar1->lexbuf[uVar6] == ' ' &&
      (pNVar7->end = uVar6, uVar6 <= pNVar7->start)))) {
    prvTidyDiscardElement(doc,pNVar7);
  }
  return (Node *)0x0;
}

Assistant:

static Node* ParseXMLElement(TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    if ( element == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        element = memory.original_node;
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        mode = memory.reentry_mode;
        TY_(InsertNodeAtEnd)(element, node); /* The only re-entry action needed. */
    }
    else
    {
        /* if node is pre or has xml:space="preserve" then do so */
        if ( TY_(XMLPreserveWhiteSpace)(doc, element) )
            mode = Preformatted;

        /* deal with comments etc. */
        InsertMisc( &doc->root, element);
        
        /* we shouldn't have plain text at this point. */
        if (TY_(nodeIsText)(element))
        {
            TY_(Report)(doc, &doc->root, element, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, element);
            return NULL;
        }
    }
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->type == EndTag &&
           node->element && element->element &&
           TY_(tmbstrcmp)(node->element, element->element) == 0)
        {
            TY_(FreeNode)( doc, node);
            element->closed = yes;
            break;
        }

        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            if (element)
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_IN);
            else
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_ERR);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* parse content on seeing start tag */
        if (node->type == StartTag)
        {
            TidyParserMemory memory = {0};
            memory.identity = ParseXMLElement;
            memory.original_node = element;
            memory.reentry_node = node;
            memory.reentry_mode = mode;
            TY_(pushMemory)( doc, memory );
            return node;
        }

        TY_(InsertNodeAtEnd)(element, node);
    } /* while */

    /*
     if first child is text then trim initial space and
     delete text node if it is empty.
    */

    node = element->content;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->start] == ' ' )
        {
            node->start++;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }

    /*
     if last child is text then trim final space and
     delete the text node if it is empty
    */

    node = element->last;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->end - 1] == ' ' )
        {
            node->end--;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }
    return NULL;
}